

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Config::~Config(Config *this)

{
  (this->super_IConfig)._vptr_IConfig = (_func_int **)&PTR__Config_001b7558;
  std::ios::rdbuf((streambuf *)(&this->m_os + *(long *)(*(long *)&this->m_os + -0x18)));
  Stream::release(&this->m_stream);
  std::ios_base::~ios_base((ios_base *)&this->field_0xe0);
  ConfigData::~ConfigData(&this->m_data);
  return;
}

Assistant:

virtual ~Config() {
            m_os.rdbuf( std::cout.rdbuf() );
            m_stream.release();
        }